

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_routing_linux.c
# Opt level: O0

int os_routing_linux_query(os_route *route)

{
  int iVar1;
  int seq;
  rtgenmsg *rt_gen;
  nlmsghdr *msg;
  uint8_t buffer [1024];
  os_route *route_local;
  
  buffer._1016_8_ = route;
  if ((route->cb_finished == (_func_void_os_route_ptr_int *)0x0) ||
     (route->cb_get == (_func_void_os_route_ptr_os_route_ptr *)0x0)) {
    if ((log_global_mask[_oonf_os_routing_subsystem.logging] & 8) != 0) {
      oonf_log(LOG_SEVERITY_ASSERT,_oonf_os_routing_subsystem.logging,
               "src/base/os_linux/os_routing_linux.c",0x11d,(void *)0x0,0,"illegal route query");
      abort();
    }
  }
  memset(&msg,0,0x400);
  msg._6_2_ = 0x301;
  msg._0_4_ = 0x11;
  msg._4_2_ = 0x1a;
  buffer[8] = *(uint8_t *)buffer._1016_8_;
  iVar1 = os_system_linux_netlink_send(&_rtnetlink_socket,(nlmsghdr *)&msg);
  if (iVar1 < 0) {
    route_local._4_4_ = -1;
  }
  else {
    *(int *)(buffer._1016_8_ + 0x98) = iVar1;
    *(long *)(buffer._1016_8_ + 0x88) = buffer._1016_8_ + 0x98;
    avl_insert(&_rtnetlink_feedback,(avl_node *)(buffer._1016_8_ + 0x60));
    route_local._4_4_ = 0;
  }
  return route_local._4_4_;
}

Assistant:

int
os_routing_linux_query(struct os_route *route) {
  uint8_t buffer[UIO_MAXIOV];
  struct nlmsghdr *msg;
  struct rtgenmsg *rt_gen;
  int seq;

  OONF_ASSERT(route->cb_finished != NULL && route->cb_get != NULL, LOG_OS_ROUTING, "illegal route query");
  memset(buffer, 0, sizeof(buffer));

  /* get pointers for netlink message */
  msg = (void *)&buffer[0];
  rt_gen = NLMSG_DATA(msg);

  msg->nlmsg_flags = NLM_F_REQUEST | NLM_F_DUMP;

  /* set length of netlink message with rtmsg payload */
  msg->nlmsg_len = NLMSG_LENGTH(sizeof(*rt_gen));

  msg->nlmsg_type = RTM_GETROUTE;
  rt_gen->rtgen_family = route->p.family;

  seq = os_system_linux_netlink_send(&_rtnetlink_socket, msg);
  if (seq < 0) {
    return -1;
  }

  route->_internal.nl_seq = seq;
  route->_internal._node.key = &route->_internal.nl_seq;
  avl_insert(&_rtnetlink_feedback, &route->_internal._node);
  return 0;
}